

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Cell.h
# Opt level: O2

TV __thiscall Nova::Grid_Iterator_Cell<float,_1>::Location(Grid_Iterator_Cell<float,_1> *this)

{
  undefined8 *in_RSI;
  TV TVar1;
  
  TVar1 = Grid<float,_1>::Center((Grid<float,_1> *)this,(T_INDEX *)*in_RSI);
  return (TV)TVar1._data._M_elems[0];
}

Assistant:

TV Location() const
    {return grid.Center(index);}